

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox
               (ImDrawList *out_draw_list,ImDrawList *draw_list,ImDrawCmd *draw_cmd,bool show_mesh,
               bool show_aabb)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  ImDrawVert *pIVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  unsigned_short *puVar13;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ImVec2 triangle [3];
  undefined8 local_98;
  ImVec2 local_88;
  ImVec2 local_78 [4];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((draw_list->IdxBuffer).Size < 1) {
    puVar13 = (unsigned_short *)0x0;
  }
  else {
    puVar13 = (draw_list->IdxBuffer).Data;
  }
  uVar4 = draw_cmd->VtxOffset;
  pIVar6 = (draw_list->VtxBuffer).Data;
  uVar2._0_4_ = (draw_cmd->ClipRect).x;
  uVar2._4_4_ = (draw_cmd->ClipRect).y;
  uVar3._0_4_ = (draw_cmd->ClipRect).z;
  uVar3._4_4_ = (draw_cmd->ClipRect).w;
  uVar5 = out_draw_list->Flags;
  out_draw_list->Flags = uVar5 & 0xfffffffe;
  uVar9 = draw_cmd->IdxOffset;
  uVar10 = draw_cmd->ElemCount;
  if (uVar9 < uVar10 + uVar9) {
    uStack_50 = 0;
    uStack_40 = 0;
    uVar14 = (ulong)uVar9;
    auVar20 = _DAT_00165f90;
    auVar21 = _DAT_00165ef0;
    local_58 = uVar2;
    local_48 = uVar3;
    do {
      local_78[0].x = 0.0;
      local_78[0].y = 0.0;
      local_78[1].x = 0.0;
      local_78[1].y = 0.0;
      local_78[2].x = 0.0;
      local_78[2].y = 0.0;
      lVar12 = 0;
      uVar2._0_4_ = auVar21._0_4_;
      uVar3._0_4_ = auVar21._4_4_;
      uVar15 = auVar21._8_4_;
      uVar16 = auVar21._12_4_;
      uVar2._4_4_ = auVar20._0_4_;
      uVar3._4_4_ = auVar20._4_4_;
      uVar17 = auVar20._8_4_;
      uVar18 = auVar20._12_4_;
      do {
        uVar1 = (uVar14 & 0xffffffff) + lVar12;
        uVar11 = (uint)uVar1;
        if (puVar13 != (unsigned_short *)0x0) {
          uVar11 = (uint)puVar13[uVar1 & 0xffffffff];
        }
        IVar7 = pIVar6[(ulong)uVar4 + (ulong)uVar11].pos;
        local_78[lVar12] = IVar7;
        auVar19._8_8_ = 0;
        auVar19._0_4_ = IVar7.x;
        auVar19._4_4_ = IVar7.y;
        auVar20._4_4_ = (float)uVar3;
        auVar20._0_4_ = (float)uVar2;
        auVar20._8_4_ = uVar15;
        auVar20._12_4_ = uVar16;
        auVar21 = minps(auVar19,auVar20);
        auVar8._4_4_ = uVar3._4_4_;
        auVar8._0_4_ = uVar2._4_4_;
        auVar8._8_4_ = uVar17;
        auVar8._12_4_ = uVar18;
        auVar20 = maxps(auVar19,auVar8);
        lVar12 = lVar12 + 1;
        uVar2._0_4_ = auVar21._0_4_;
        uVar3._0_4_ = auVar21._4_4_;
        uVar15 = auVar21._8_4_;
        uVar16 = auVar21._12_4_;
        uVar2._4_4_ = auVar20._0_4_;
        uVar3._4_4_ = auVar20._4_4_;
        uVar17 = auVar20._8_4_;
        uVar18 = auVar20._12_4_;
      } while (lVar12 != 3);
      if (show_mesh) {
        ImDrawList::AddPolyline(out_draw_list,local_78,3,0xff00ffff,true,1.0);
        uVar9 = draw_cmd->IdxOffset;
        uVar10 = draw_cmd->ElemCount;
      }
      uVar14 = (uVar14 & 0xffffffff) + 3;
    } while ((uint)uVar14 < uVar10 + uVar9);
    local_88.y = (float)(int)(float)uVar3;
    local_88.x = (float)(int)(float)uVar2;
    local_98 = CONCAT44((float)(int)uVar3._4_4_,(float)(int)uVar2._4_4_);
    uVar2._0_4_ = (float)local_58;
    uVar2._4_4_ = local_58._4_4_;
    uVar3._0_4_ = (float)local_48;
    uVar3._4_4_ = local_48._4_4_;
  }
  if (show_aabb) {
    local_78[0].y = (float)(int)uVar2._4_4_;
    local_78[0].x = (float)(int)(float)uVar2;
    local_78[3] = (ImVec2)CONCAT44((float)(int)uVar3._4_4_,(float)(int)(float)uVar3);
    ImDrawList::AddRect(out_draw_list,local_78,local_78 + 3,0xffff00ff,0.0,0xf,1.0);
    local_78[0] = local_88;
    local_78[3].x = (float)(undefined4)local_98;
    local_78[3].y = (float)local_98._4_4_;
    ImDrawList::AddRect(out_draw_list,local_78,local_78 + 3,0xffffff00,0.0,0xf,1.0);
  }
  out_draw_list->Flags = uVar5;
  return;
}

Assistant:

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList* out_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, bool show_mesh, bool show_aabb)
{
    IM_ASSERT(show_mesh || show_aabb);
    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
    ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + draw_cmd->VtxOffset;

    // Draw wire-frame version of all triangles
    ImRect clip_rect = draw_cmd->ClipRect;
    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    ImDrawListFlags backup_flags = out_draw_list->Flags;
    out_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
    for (unsigned int idx_n = draw_cmd->IdxOffset; idx_n < draw_cmd->IdxOffset + draw_cmd->ElemCount; )
    {
        ImVec2 triangle[3];
        for (int n = 0; n < 3; n++, idx_n++)
            vtxs_rect.Add((triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos));
        if (show_mesh)
            out_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
    }
    // Draw bounding boxes
    if (show_aabb)
    {
        out_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
        out_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
    }
    out_draw_list->Flags = backup_flags;
}